

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_decoder.cc
# Opt level: O2

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::StlDecoder::DecodeFromFile
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>
           *__return_storage_ptr__,StlDecoder *this,string *file_name)

{
  bool bVar1;
  StlDecoder *this_00;
  vector<char,_std::allocator<char>_> data;
  DecoderBuffer buffer;
  allocator<char> local_89;
  _Vector_base<char,_std::allocator<char>_> local_88;
  undefined1 local_68 [24];
  BitDecoder local_50;
  string local_30 [32];
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = ReadFileToBuffer(file_name,(vector<char,_std::allocator<char>_> *)&local_88);
  if (bVar1) {
    DecoderBuffer::DecoderBuffer((DecoderBuffer *)local_68);
    this_00 = (StlDecoder *)local_88._M_impl.super__Vector_impl_data._M_start;
    DecoderBuffer::Init((DecoderBuffer *)local_68,local_88._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_88._M_impl.super__Vector_impl_data._M_start);
    DecodeFromBuffer(__return_storage_ptr__,this_00,(DecoderBuffer *)local_68);
    DecoderBuffer::BitDecoder::~BitDecoder(&local_50);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_30,"Unable to read input file.",&local_89);
    local_68._0_4_ = IO_ERROR;
    std::__cxx11::string::string((string *)(local_68 + 8),local_30);
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              (__return_storage_ptr__,(Status *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 8));
    std::__cxx11::string::~string(local_30);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> StlDecoder::DecodeFromFile(
    const std::string &file_name) {
  std::vector<char> data;
  if (!ReadFileToBuffer(file_name, &data)) {
    return Status(Status::IO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer buffer;
  buffer.Init(data.data(), data.size());
  return DecodeFromBuffer(&buffer);
}